

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmx-impl.inc.c
# Opt level: O0

void gen_vprtybd(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  TCGv_ptr arg2;
  TCGv_ptr arg1;
  TCGv_ptr rd;
  TCGv_ptr rb;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (((ctx->altivec_enabled ^ 0xffU) & 1) == 0) {
    uVar1 = rB(ctx->opcode);
    arg2 = gen_avr_ptr(tcg_ctx_00,uVar1);
    uVar1 = rD(ctx->opcode);
    arg1 = gen_avr_ptr(tcg_ctx_00,uVar1);
    gen_helper_vprtybd(tcg_ctx_00,arg1,arg2);
    tcg_temp_free_ptr(tcg_ctx_00,arg2);
    tcg_temp_free_ptr(tcg_ctx_00,arg1);
  }
  else {
    gen_exception(ctx,0x49);
  }
  return;
}

Assistant:

static void gen_vsplt(DisasContext *ctx, int vece)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int uimm, dofs, bofs;

    if (unlikely(!ctx->altivec_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VPU);
        return;
    }

    uimm = UIMM5(ctx->opcode);
    bofs = avr_full_offset(rB(ctx->opcode));
    dofs = avr_full_offset(rD(ctx->opcode));

    /* Experimental testing shows that hardware masks the immediate.  */
    bofs += (uimm << vece) & 15;
#ifndef HOST_WORDS_BIGENDIAN
    bofs ^= 15;
    bofs &= ~((1 << vece) - 1);
#endif

    tcg_gen_gvec_dup_mem(tcg_ctx, vece, dofs, bofs, 16, 16);
}